

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

float ncnn::vstr_to_float(char *vstr)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char *p;
  char *pcVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  int iVar20;
  
  bVar2 = *vstr;
  if ((bVar2 == 0x2d) || (bVar3 = bVar2, bVar2 == 0x2b)) {
    pbVar1 = (byte *)(vstr + 1);
    vstr = vstr + 1;
    bVar3 = *pbVar1;
  }
  uVar5 = (uint)bVar3;
  uVar7 = (int)(char)bVar3 - 0x30;
  dVar14 = 0.0;
  if (uVar7 < 10) {
    uVar9 = 0;
    do {
      uVar9 = uVar7 + uVar9 * 10;
      uVar5 = (uint)vstr[1];
      vstr = vstr + 1;
      uVar7 = uVar5 - 0x30;
    } while (uVar7 < 10);
    dVar14 = (double)uVar9;
  }
  if ((char)uVar5 == '.') {
    uVar5 = (uint)vstr[1];
    vstr = vstr + 1;
    uVar7 = uVar5 - 0x30;
    if (uVar7 < 10) {
      uVar9 = 1;
      uVar10 = 0;
      do {
        uVar10 = uVar7 + uVar10 * 10;
        uVar9 = uVar9 * 10;
        uVar5 = (uint)vstr[1];
        vstr = vstr + 1;
        uVar7 = uVar5 - 0x30;
      } while (uVar7 < 10);
      dVar15 = (double)uVar10 / (double)uVar9;
    }
    else {
      dVar15 = 0.0;
    }
    dVar14 = dVar14 + dVar15;
  }
  if ((uVar5 & 0xff | 0x20) == 0x65) {
    cVar4 = vstr[1];
    if ((cVar4 == '-') || (cVar4 == '+')) {
      pcVar12 = vstr + 2;
      cVar6 = vstr[2];
    }
    else {
      pcVar12 = vstr + 1;
      cVar6 = cVar4;
    }
    uVar7 = (int)cVar6 - 0x30;
    if (uVar7 < 10) {
      uVar5 = 0;
      do {
        pcVar12 = pcVar12 + 1;
        uVar5 = uVar7 + uVar5 * 10;
        uVar7 = (int)*pcVar12 - 0x30;
      } while (uVar7 < 10);
      dVar15 = 1.0;
      for (; 7 < uVar5; uVar5 = uVar5 - 8) {
        dVar15 = dVar15 * 100000000.0;
      }
      if (uVar5 != 0) {
        dVar18 = 1.0;
        iVar20 = 2;
        do {
          dVar17 = dVar18;
          dVar16 = dVar15;
          dVar15 = dVar16 * 10.0;
          dVar18 = dVar17 * 10.0;
          iVar8 = iVar20 + -2;
          iVar11 = iVar20 + (uVar5 + 1 & 0xe);
          iVar20 = iVar8;
        } while (iVar11 != 4);
        uVar7 = -iVar8;
        iVar20 = -(uint)((int)(uVar5 - 1 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000));
        iVar8 = -(uint)((int)(uVar5 - 1 ^ 0x80000000) < (int)((uVar7 | 1) ^ 0x80000000));
        auVar19._0_8_ = CONCAT44(iVar20,iVar20);
        auVar19._8_4_ = iVar8;
        auVar19._12_4_ = iVar8;
        dVar15 = (double)(~auVar19._8_8_ & (ulong)dVar18 | (ulong)dVar17 & auVar19._8_8_) *
                 (double)(~auVar19._0_8_ & (ulong)dVar15 | (ulong)dVar16 & auVar19._0_8_);
      }
    }
    else {
      dVar15 = 1.0;
    }
    if (cVar4 == '-') {
      dVar14 = dVar14 / dVar15;
    }
    else {
      dVar14 = dVar14 * dVar15;
    }
  }
  fVar13 = (float)dVar14;
  if (bVar2 == 0x2d) {
    fVar13 = -fVar13;
  }
  return fVar13;
}

Assistant:

static float vstr_to_float(const char vstr[16])
{
    double v = 0.0;

    const char* p = vstr;

    // sign
    bool sign = *p != '-';
    if (*p == '+' || *p == '-')
    {
        p++;
    }

    // digits before decimal point or exponent
    unsigned int v1 = 0;
    while (isdigit(*p))
    {
        v1 = v1 * 10 + (*p - '0');
        p++;
    }

    v = (double)v1;

    // digits after decimal point
    if (*p == '.')
    {
        p++;

        unsigned int pow10 = 1;
        unsigned int v2 = 0;

        while (isdigit(*p))
        {
            v2 = v2 * 10 + (*p - '0');
            pow10 *= 10;
            p++;
        }

        v += v2 / (double)pow10;
    }

    // exponent
    if (*p == 'e' || *p == 'E')
    {
        p++;

        // sign of exponent
        bool fact = *p != '-';
        if (*p == '+' || *p == '-')
        {
            p++;
        }

        // digits of exponent
        unsigned int expon = 0;
        while (isdigit(*p))
        {
            expon = expon * 10 + (*p - '0');
            p++;
        }

        double scale = 1.0;
        while (expon >= 8)
        {
            scale *= 1e8;
            expon -= 8;
        }
        while (expon > 0)
        {
            scale *= 10.0;
            expon -= 1;
        }

        v = fact ? v * scale : v / scale;
    }

    //     fprintf(stderr, "v = %f\n", v);
    return sign ? (float)v : (float)-v;
}